

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

ssize_t ossl_send(Curl_easy *data,int sockindex,void *mem,size_t len,CURLcode *curlcode)

{
  connectdata *pcVar1;
  ssl_backend_data *psVar2;
  uint uVar3;
  int err;
  uint *puVar4;
  ulong uVar5;
  char *pcVar6;
  size_t sVar7;
  size_t size;
  size_t size_00;
  char error_buffer [256];
  
  pcVar1 = data->conn;
  psVar2 = pcVar1->ssl[sockindex].backend;
  ERR_clear_error();
  sVar7 = 0x7fffffff;
  if (len < 0x7fffffff) {
    sVar7 = len;
  }
  (pcVar1->ssl[0].backend)->logger = data;
  uVar3 = SSL_write((SSL *)psVar2->handle,mem,(int)sVar7);
  if ((int)uVar3 < 1) {
    err = SSL_get_error((SSL *)psVar2->handle,uVar3);
    if (err - 2U < 2) {
      *curlcode = CURLE_AGAIN;
    }
    else {
      if (err == 1) {
        uVar5 = ERR_get_error();
        if ((((int)uVar5 == 0xa000080) && (pcVar1->ssl[sockindex].state == ssl_connection_complete))
           && (pcVar1->proxy_ssl[sockindex].state == ssl_connection_complete)) {
          ossl_version(error_buffer,0x78);
          pcVar6 = "Error: %s does not support double SSL tunneling.";
        }
        else {
          ossl_strerror(uVar5,error_buffer,size_00);
          pcVar6 = "SSL_write() error: %s";
        }
        Curl_failf(data,pcVar6,error_buffer);
      }
      else {
        if (err == 5) {
          puVar4 = (uint *)__errno_location();
          uVar3 = *puVar4;
          uVar5 = ERR_get_error();
          if (uVar5 == 0) {
            if (uVar3 == 0) {
              strncpy(error_buffer,"SSL_ERROR_SYSCALL",0x100);
              error_buffer[0xff] = '\0';
            }
            else {
              Curl_strerror(uVar3,error_buffer,0x100);
            }
          }
          else {
            ossl_strerror(uVar5,error_buffer,size);
          }
          pcVar6 = error_buffer;
        }
        else {
          pcVar6 = SSL_ERROR_to_str(err);
          puVar4 = (uint *)__errno_location();
          uVar3 = *puVar4;
        }
        Curl_failf(data,"OpenSSL SSL_write: %s, errno %d",pcVar6,(ulong)uVar3);
      }
      *curlcode = CURLE_SEND_ERROR;
    }
    uVar5 = 0xffffffffffffffff;
  }
  else {
    *curlcode = CURLE_OK;
    uVar5 = (ulong)uVar3;
  }
  return uVar5;
}

Assistant:

static ssize_t ossl_send(struct Curl_easy *data,
                         int sockindex,
                         const void *mem,
                         size_t len,
                         CURLcode *curlcode)
{
  /* SSL_write() is said to return 'int' while write() and send() returns
     'size_t' */
  int err;
  char error_buffer[256];
  unsigned long sslerror;
  int memlen;
  int rc;
  struct connectdata *conn = data->conn;
  struct ssl_connect_data *connssl = &conn->ssl[sockindex];
  struct ssl_backend_data *backend = connssl->backend;

  DEBUGASSERT(backend);

  ERR_clear_error();

  memlen = (len > (size_t)INT_MAX) ? INT_MAX : (int)len;
  set_logger(conn, data);
  rc = SSL_write(backend->handle, mem, memlen);

  if(rc <= 0) {
    err = SSL_get_error(backend->handle, rc);

    switch(err) {
    case SSL_ERROR_WANT_READ:
    case SSL_ERROR_WANT_WRITE:
      /* The operation did not complete; the same TLS/SSL I/O function
         should be called again later. This is basically an EWOULDBLOCK
         equivalent. */
      *curlcode = CURLE_AGAIN;
      return -1;
    case SSL_ERROR_SYSCALL:
      {
        int sockerr = SOCKERRNO;
        sslerror = ERR_get_error();
        if(sslerror)
          ossl_strerror(sslerror, error_buffer, sizeof(error_buffer));
        else if(sockerr)
          Curl_strerror(sockerr, error_buffer, sizeof(error_buffer));
        else {
          strncpy(error_buffer, SSL_ERROR_to_str(err), sizeof(error_buffer));
          error_buffer[sizeof(error_buffer) - 1] = '\0';
        }
        failf(data, OSSL_PACKAGE " SSL_write: %s, errno %d",
              error_buffer, sockerr);
        *curlcode = CURLE_SEND_ERROR;
        return -1;
      }
    case SSL_ERROR_SSL:
      /*  A failure in the SSL library occurred, usually a protocol error.
          The OpenSSL error queue contains more information on the error. */
      sslerror = ERR_get_error();
      if(ERR_GET_LIB(sslerror) == ERR_LIB_SSL &&
         ERR_GET_REASON(sslerror) == SSL_R_BIO_NOT_SET &&
         conn->ssl[sockindex].state == ssl_connection_complete
#ifndef CURL_DISABLE_PROXY
         && conn->proxy_ssl[sockindex].state == ssl_connection_complete
#endif
        ) {
        char ver[120];
        (void)ossl_version(ver, sizeof(ver));
        failf(data, "Error: %s does not support double SSL tunneling.", ver);
      }
      else
        failf(data, "SSL_write() error: %s",
              ossl_strerror(sslerror, error_buffer, sizeof(error_buffer)));
      *curlcode = CURLE_SEND_ERROR;
      return -1;
    }
    /* a true error */
    failf(data, OSSL_PACKAGE " SSL_write: %s, errno %d",
          SSL_ERROR_to_str(err), SOCKERRNO);
    *curlcode = CURLE_SEND_ERROR;
    return -1;
  }
  *curlcode = CURLE_OK;
  return (ssize_t)rc; /* number of bytes */
}